

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O0

int __thiscall
wabt::string_view::compare(string_view *this,size_type pos1,size_type n1,string_view s)

{
  string_view s_00;
  int iVar1;
  string_view local_40;
  size_type local_30;
  size_type n1_local;
  size_type pos1_local;
  string_view *this_local;
  string_view s_local;
  
  s_local.data_ = (char *)s.size_;
  this_local = (string_view *)s.data_;
  local_30 = n1;
  n1_local = pos1;
  pos1_local = (size_type)this;
  local_40 = substr(this,pos1,n1);
  s_00.size_ = (size_type)s_local.data_;
  s_00.data_ = (char *)this_local;
  iVar1 = compare(&local_40,s_00);
  return iVar1;
}

Assistant:

int string_view::compare(size_type pos1, size_type n1, string_view s) const {
  return substr(pos1, n1).compare(s);
}